

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReconv.c
# Opt level: O0

DdNode * Abc_NodeConeDcs(DdManager *dd,DdNode **pbVarsX,DdNode **pbVarsY,Vec_Ptr_t *vLeaves,
                        Vec_Ptr_t *vRoots,Vec_Ptr_t *vVisited)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pAVar5;
  DdNode *pDVar6;
  DdNode *pDVar7;
  int local_7c;
  int i;
  Abc_Obj_t *pNode;
  DdNode *bResult;
  DdNode *bCube;
  DdNode *bTemp;
  DdNode *bTrans;
  DdNode *bFunc;
  DdNode *bFunc1;
  DdNode *bFunc0;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vRoots_local;
  Vec_Ptr_t *vLeaves_local;
  DdNode **pbVarsY_local;
  DdNode **pbVarsX_local;
  DdManager *dd_local;
  
  Abc_NodeConeCollect((Abc_Obj_t **)vRoots->pArray,vRoots->nSize,vLeaves,vVisited,0);
  for (local_7c = 0; iVar2 = Vec_PtrSize(vLeaves), local_7c < iVar2; local_7c = local_7c + 1) {
    pvVar4 = Vec_PtrEntry(vLeaves,local_7c);
    *(DdNode **)((long)pvVar4 + 0x40) = pbVarsX[local_7c];
  }
  for (local_7c = 0; iVar2 = Vec_PtrSize(vVisited), local_7c < iVar2; local_7c = local_7c + 1) {
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vVisited,local_7c);
    pAVar5 = Abc_ObjFanin0(pObj);
    pvVar4 = (pAVar5->field_6).pTemp;
    iVar2 = Abc_ObjFaninC0(pObj);
    pAVar5 = Abc_ObjFanin1(pObj);
    pvVar1 = (pAVar5->field_6).pTemp;
    iVar3 = Abc_ObjFaninC1(pObj);
    pAVar5 = (Abc_Obj_t *)
             Cudd_bddAnd(dd,(DdNode *)((ulong)pvVar4 ^ (long)iVar2),
                         (DdNode *)((ulong)pvVar1 ^ (long)iVar3));
    Cudd_Ref((DdNode *)pAVar5);
    (pObj->field_6).pCopy = pAVar5;
  }
  bTemp = dd->one;
  Cudd_Ref(bTemp);
  for (local_7c = 0; iVar2 = Vec_PtrSize(vRoots), local_7c < iVar2; local_7c = local_7c + 1) {
    pvVar4 = Vec_PtrEntry(vRoots,local_7c);
    pDVar6 = Cudd_bddXnor(dd,*(DdNode **)((long)pvVar4 + 0x40),pbVarsY[local_7c]);
    Cudd_Ref(pDVar6);
    pDVar7 = Cudd_bddAnd(dd,bTemp,pDVar6);
    Cudd_Ref(pDVar7);
    Cudd_RecursiveDeref(dd,bTemp);
    Cudd_RecursiveDeref(dd,pDVar6);
    bTemp = pDVar7;
  }
  for (local_7c = 0; iVar2 = Vec_PtrSize(vVisited), local_7c < iVar2; local_7c = local_7c + 1) {
    pvVar4 = Vec_PtrEntry(vVisited,local_7c);
    Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar4 + 0x40));
  }
  pDVar6 = Extra_bddComputeRangeCube(dd,vRoots->nSize,vRoots->nSize + vLeaves->nSize);
  Cudd_Ref(pDVar6);
  pDVar7 = Cudd_bddExistAbstract(dd,bTemp,pDVar6);
  Cudd_Ref(pDVar7);
  Cudd_RecursiveDeref(dd,pDVar6);
  Cudd_RecursiveDeref(dd,bTemp);
  Cudd_Deref((DdNode *)((ulong)pDVar7 ^ 1));
  return (DdNode *)((ulong)pDVar7 ^ 1);
}

Assistant:

DdNode * Abc_NodeConeDcs( DdManager * dd, DdNode ** pbVarsX, DdNode ** pbVarsY, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, Vec_Ptr_t * vVisited )
{
    DdNode * bFunc0, * bFunc1, * bFunc, * bTrans, * bTemp, * bCube, * bResult;
    Abc_Obj_t * pNode;
    int i;
    // get the nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( (Abc_Obj_t **)vRoots->pArray, vRoots->nSize, vLeaves, vVisited, 0 );
    // set the elementary BDDs
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)pbVarsX[i];
    // compute the BDDs for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        bFunc0 = Cudd_NotCond( Abc_ObjFanin0(pNode)->pCopy, (int)Abc_ObjFaninC0(pNode) );
        bFunc1 = Cudd_NotCond( Abc_ObjFanin1(pNode)->pCopy, (int)Abc_ObjFaninC1(pNode) );
        bFunc  = Cudd_bddAnd( dd, bFunc0, bFunc1 );    Cudd_Ref( bFunc );
        pNode->pCopy = (Abc_Obj_t *)bFunc;
    }
    // compute the transition relation of the cone
    bTrans = b1;    Cudd_Ref( bTrans );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pNode, i )
    {
        bFunc = Cudd_bddXnor( dd, (DdNode *)pNode->pCopy, pbVarsY[i] );  Cudd_Ref( bFunc );
        bTrans = Cudd_bddAnd( dd, bTemp = bTrans, bFunc );               Cudd_Ref( bTrans );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bFunc );
    }
    // dereference the intermediate ones
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pNode->pCopy );
    // compute don't-cares
    bCube = Extra_bddComputeRangeCube( dd, vRoots->nSize, vRoots->nSize + vLeaves->nSize );  Cudd_Ref( bCube );
    bResult = Cudd_bddExistAbstract( dd, bTrans, bCube );                Cudd_Ref( bResult );
    bResult = Cudd_Not( bResult );
    Cudd_RecursiveDeref( dd, bCube );
    Cudd_RecursiveDeref( dd, bTrans );
    Cudd_Deref( bResult );
    return bResult;
}